

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib643.c
# Opt level: O0

int cyclic_add(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  curl_mimepart *subpart;
  curl_mime *submime;
  CURLcode a1;
  curl_mimepart *part;
  curl_mime *mime;
  CURL *easy;
  
  uVar1 = curl_easy_init();
  uVar2 = curl_mime_init(uVar1);
  uVar3 = curl_mime_addpart(uVar2);
  submime._4_4_ = curl_mime_subparts(uVar3,uVar2);
  if (submime._4_4_ == 0x2b) {
    uVar4 = curl_mime_init(uVar1);
    uVar5 = curl_mime_addpart(uVar4);
    curl_mime_subparts(uVar3,uVar4);
    submime._4_4_ = curl_mime_subparts(uVar5,uVar2);
  }
  curl_mime_free(uVar2);
  curl_easy_cleanup(uVar1);
  easy._4_4_ = (uint)(submime._4_4_ != 0x2b);
  return easy._4_4_;
}

Assistant:

static int cyclic_add(void)
{
  CURL *easy = curl_easy_init();
  curl_mime *mime = curl_mime_init(easy);
  curl_mimepart *part = curl_mime_addpart(mime);
  CURLcode a1 = curl_mime_subparts(part, mime);

  if(a1 == CURLE_BAD_FUNCTION_ARGUMENT) {
    curl_mime *submime = curl_mime_init(easy);
    curl_mimepart *subpart = curl_mime_addpart(submime);

    curl_mime_subparts(part, submime);
    a1 = curl_mime_subparts(subpart, mime);
  }

  curl_mime_free(mime);
  curl_easy_cleanup(easy);
  if(a1 != CURLE_BAD_FUNCTION_ARGUMENT)
    /* that should have failed */
    return 1;

  return 0;
}